

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cc
# Opt level: O0

Player * Player::create(Player_Type pt,uint sample_rate)

{
  uint uVar1;
  Generic_Player<(Player_Type)0> *this;
  Generic_Player<(Player_Type)1> *this_00;
  pointer pPVar2;
  unique_ptr<Player,_std::default_delete<Player>_> local_20;
  unique_ptr<Player,_std::default_delete<Player>_> instance;
  uint sample_rate_local;
  Player_Type pt_local;
  
  instance._M_t.super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
  super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
  super__Head_base<0UL,_Player_*,_false>._M_head_impl._0_4_ = sample_rate;
  instance._M_t.super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
  super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
  super__Head_base<0UL,_Player_*,_false>._M_head_impl._4_4_ = pt;
  std::unique_ptr<Player,std::default_delete<Player>>::unique_ptr<std::default_delete<Player>,void>
            ((unique_ptr<Player,std::default_delete<Player>> *)&local_20);
  if (instance._M_t.super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
      super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
      super__Head_base<0UL,_Player_*,_false>._M_head_impl._4_4_ == OPL3) {
    this = (Generic_Player<(Player_Type)0> *)operator_new(0x48);
    Generic_Player<(Player_Type)0>::Generic_Player(this);
    std::unique_ptr<Player,_std::default_delete<Player>_>::reset(&local_20,(pointer)this);
  }
  else {
    if (instance._M_t.super___uniq_ptr_impl<Player,_std::default_delete<Player>_>._M_t.
        super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>.
        super__Head_base<0UL,_Player_*,_false>._M_head_impl._4_4_ != OPN2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/sources/player.cc"
                    ,0xf,"static Player *Player::create(Player_Type, unsigned int)");
    }
    this_00 = (Generic_Player<(Player_Type)1> *)operator_new(0x48);
    Generic_Player<(Player_Type)1>::Generic_Player(this_00);
    std::unique_ptr<Player,_std::default_delete<Player>_>::reset(&local_20,(pointer)this_00);
  }
  pPVar2 = std::unique_ptr<Player,_std::default_delete<Player>_>::operator->(&local_20);
  uVar1 = (**pPVar2->_vptr_Player)
                    (pPVar2,(ulong)(uint)instance._M_t.
                                         super___uniq_ptr_impl<Player,_std::default_delete<Player>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_Player_*,_std::default_delete<Player>_>
                                         .super__Head_base<0UL,_Player_*,_false>._M_head_impl);
  if ((uVar1 & 1) == 0) {
    _sample_rate_local = (pointer)0x0;
  }
  else {
    _sample_rate_local = std::unique_ptr<Player,_std::default_delete<Player>_>::release(&local_20);
  }
  std::unique_ptr<Player,_std::default_delete<Player>_>::~unique_ptr(&local_20);
  return _sample_rate_local;
}

Assistant:

Player *Player::create(Player_Type pt, unsigned sample_rate)
{
    std::unique_ptr<Player> instance;
    switch (pt) {
    default: assert(false); abort();
    #define PLAYER_CASE(x)                                                  \
        case Player_Type::x: instance.reset(new Generic_Player<Player_Type::x>); break;
    EACH_PLAYER_TYPE(PLAYER_CASE);
    #undef PLAYER_CASE
    }
    if (!instance->init(sample_rate))
        return nullptr;
    return instance.release();
}